

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

HighsInt __thiscall
HEkk::addBadBasisChange
          (HEkk *this,HighsInt row_out,HighsInt variable_out,HighsInt variable_in,
          BadBasisChangeReason reason,bool taboo)

{
  pointer *ppHVar1;
  pointer pHVar2;
  iterator __position;
  uint uVar3;
  uint uVar4;
  BadBasisChangeReason *pBVar5;
  long lVar6;
  bool bVar7;
  HighsSimplexBadBasisChangeRecord record;
  HighsSimplexBadBasisChangeRecord local_48;
  
  pHVar2 = (this->bad_basis_change_).
           super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->bad_basis_change_).
       super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (uint)((ulong)((long)__position._M_current - (long)pHVar2) >> 5);
  if ((int)uVar4 < 1) {
    uVar3 = 0xffffffff;
  }
  else {
    pBVar5 = &pHVar2->reason;
    lVar6 = 0;
    do {
      uVar3 = (uint)lVar6;
      if (*pBVar5 == reason &&
          (pBVar5[-1] == variable_in && (pBVar5[-2] == variable_out && pBVar5[-3] == row_out)))
      break;
      pBVar5 = pBVar5 + 8;
      bVar7 = (ulong)(uVar4 & 0x7fffffff) - 1 != lVar6;
      lVar6 = lVar6 + 1;
      uVar3 = 0xffffffff;
    } while (bVar7);
  }
  if ((int)uVar3 < 0) {
    local_48.taboo = taboo;
    if (__position._M_current ==
        (this->bad_basis_change_).
        super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_48.row_out = row_out;
      local_48.variable_out = variable_out;
      local_48.variable_in = variable_in;
      local_48.reason = reason;
      std::vector<HighsSimplexBadBasisChangeRecord,std::allocator<HighsSimplexBadBasisChangeRecord>>
      ::_M_realloc_insert<HighsSimplexBadBasisChangeRecord_const&>
                ((vector<HighsSimplexBadBasisChangeRecord,std::allocator<HighsSimplexBadBasisChangeRecord>>
                  *)&this->bad_basis_change_,__position,&local_48);
    }
    else {
      *(ulong *)&(__position._M_current)->reason = CONCAT44(local_48._20_4_,reason);
      (__position._M_current)->save_value = local_48.save_value;
      (__position._M_current)->taboo = taboo;
      *(undefined3 *)&(__position._M_current)->field_0x1 = local_48._1_3_;
      (__position._M_current)->row_out = row_out;
      (__position._M_current)->variable_out = variable_out;
      (__position._M_current)->variable_in = variable_in;
      ppHVar1 = &(this->bad_basis_change_).
                 super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppHVar1 = *ppHVar1 + 1;
    }
    uVar3 = (int)((ulong)((long)(this->bad_basis_change_).
                                super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->bad_basis_change_).
                               super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
  }
  else {
    pHVar2[uVar3].taboo = taboo;
  }
  return uVar3;
}

Assistant:

HighsInt HEkk::addBadBasisChange(const HighsInt row_out,
                                 const HighsInt variable_out,
                                 const HighsInt variable_in,
                                 const BadBasisChangeReason reason,
                                 const bool taboo) {
  assert(0 <= row_out && row_out <= lp_.num_row_);
  assert(0 <= variable_out && variable_out <= lp_.num_col_ + lp_.num_row_);
  if (variable_in >= 0) {
    assert(0 <= variable_in && variable_in <= lp_.num_col_ + lp_.num_row_);
  } else {
    assert(variable_in == -1);
  }
  // Check that this is not already on the list
  const HighsInt num_bad_basis_change = bad_basis_change_.size();
  HighsInt bad_basis_change_num = -1;
  for (HighsInt Ix = 0; Ix < num_bad_basis_change; Ix++) {
    HighsSimplexBadBasisChangeRecord& record = bad_basis_change_[Ix];
    if (record.row_out == row_out && record.variable_out == variable_out &&
        record.variable_in == variable_in && record.reason == reason) {
      bad_basis_change_num = Ix;
      break;
    }
  }
  if (bad_basis_change_num < 0) {
    // Not on the list so create record
    HighsSimplexBadBasisChangeRecord record;
    record.taboo = taboo;
    record.row_out = row_out;
    record.variable_out = variable_out;
    record.variable_in = variable_in;
    record.reason = reason;
    bad_basis_change_.push_back(record);
    bad_basis_change_num = bad_basis_change_.size() - 1;
  } else {
    // On the list so just update whether it is taboo
    bad_basis_change_[bad_basis_change_num].taboo = taboo;
  }
  return bad_basis_change_num;
}